

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::WeakDescriptorDataSection_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,string_view prefix,Descriptor *descriptor,
          int index_in_file_messages,Options *options)

{
  char *pcVar1;
  FileDescriptor *d;
  undefined4 in_register_0000008c;
  string_view name;
  undefined1 local_110 [80];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  d = (FileDescriptor *)CONCAT44(in_register_0000008c,index_in_file_messages);
  pcVar1 = *(char **)(prefix._M_str + 0x10);
  local_60.piece_ = absl::lts_20240722::NullSafeStringView("pb_");
  local_90.piece_._M_len = (size_t)this;
  local_90.piece_._M_str = (char *)prefix._M_len;
  local_c0.piece_ = absl::lts_20240722::NullSafeStringView("_");
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_110 + 0x20),(int)descriptor);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_110,&local_60,&local_90,&local_c0);
  name._M_str = pcVar1;
  name._M_len = local_110._0_8_;
  UniqueName_abi_cxx11_
            (__return_storage_ptr__,(cpp *)local_110._8_8_,name,d,
             (Options *)CONCAT44(in_register_0000008c,index_in_file_messages));
  std::__cxx11::string::~string((string *)local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string WeakDescriptorDataSection(absl::string_view prefix,
                                      const Descriptor* descriptor,
                                      int index_in_file_messages,
                                      const Options& options) {
  const auto* file = descriptor->file();

  // To make a compact name we use the index of the object in its file
  // of its name.
  // So the name could be `pb_def_3_HASH` instead of
  // `pd_def_VeryLongClassName_WithNesting_AndMoreNames_HASH`
  // We need a know common prefix to merge the sections later on.
  return UniqueName(absl::StrCat("pb_", prefix, "_", index_in_file_messages),
                    file, options);
}